

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_select_ifaces.hpp
# Opt level: O2

void __thiscall so_5::mchain_props::select_case_t::notify(select_case_t *this)

{
  undefined8 *puVar1;
  select_case_t *psVar2;
  
  while (this != (select_case_t *)0x0) {
    puVar1 = *(undefined8 **)(this + 0x10);
    psVar2 = *(select_case_t **)(this + 0x18);
    *(undefined8 *)(this + 0x10) = 0;
    *(undefined8 *)(this + 0x18) = 0;
    (**(code **)*puVar1)();
    this = psVar2;
  }
  return;
}

Assistant:

void
		notify() SO_5_NOEXCEPT
			{
				auto c = this;
				while( c )
					{
						auto next = c->giveout_next();

						auto notificator = c->m_notificator;
						// Notificator for select_case must be dropped because
						// select_case do not belong to select_case queue anymore.
						c->m_notificator = nullptr;
						notificator->notify( *c );

						c = next;
					}
			}